

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O0

Schema * kj::_::HeapArrayDisposer::allocate<capnp::Schema>(size_t count)

{
  Schema *pSVar1;
  size_t count_local;
  
  pSVar1 = (Schema *)
           allocateImpl(8,count,count,Allocate_<capnp::Schema>::construct,
                        ArrayDisposer::Dispose_<capnp::Schema>::destruct);
  return pSVar1;
}

Assistant:

T* HeapArrayDisposer::allocate(size_t count) {
  if constexpr (KJ_HAS_TRIVIAL_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(sizeof(T), count, count, nullptr, nullptr));
  } else if (KJ_HAS_NOTHROW_CONSTRUCTOR(T)) {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, nullptr));
  } else {
    return reinterpret_cast<T*>(allocateImpl(
      sizeof(T), count, count, &Allocate_<T>::construct, &Dispose_<T>::destruct));
  }
}